

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cpp
# Opt level: O1

bool __thiscall KeyStore::load(KeyStore *this,MemBuffer *buf,string *param_2)

{
  uint64_t uVar1;
  undefined8 in_RAX;
  pointer puVar2;
  long lVar3;
  int local_24 [2];
  uint t;
  
  uVar1 = buf->readpos;
  puVar2 = (buf->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start + uVar1 + 3;
  lVar3 = 0;
  do {
    *(uchar *)((long)local_24 + lVar3) = *puVar2;
    lVar3 = lVar3 + 1;
    puVar2 = puVar2 + -1;
  } while (lVar3 != 4);
  buf->readpos = uVar1 + 4;
  local_24[0] = (int)((ulong)in_RAX >> 0x20);
  if (local_24[0] == -0x1120113) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,&buf->data);
    (this->membuf).readpos = buf->readpos;
  }
  return local_24[0] == -0x1120113;
}

Assistant:

bool KeyStore::load(MemBuffer& buf, const std::string& /*pass*/)
{
    auto magic = buf.read<uint32_t>();
    if (magic != 0xfeedfeed)
        return false;
    // auto version = buf.read<uint32_t>();
    // auto count = buf.read<uint32_t>();

    membuf = buf;
    return true;
}